

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner.cc
# Opt level: O2

void __thiscall AwsCommandRunner::Remove(AwsCommandRunner *this,string *path)

{
  MultipleCommandRunner *pMVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_fd;
  allocator local_fc;
  allocator local_fb;
  allocator local_fa;
  allocator_type local_f9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  string full_url;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  GetFullUrl(&full_url,this,path);
  pMVar1 = this->command_runner_;
  std::__cxx11::string::string((string *)&local_c0,"aws",&local_fa);
  std::__cxx11::string::string(local_a0,"s3",&local_fb);
  std::__cxx11::string::string(local_80,"rm",&local_fc);
  std::__cxx11::string::string(local_60,(string *)&full_url);
  __l._M_len = 4;
  __l._M_array = &local_c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f8,__l,&local_fd);
  MultipleCommandRunner::RunCommand(pMVar1,&local_f8,true);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  lVar2 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&local_c0._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  pMVar1 = this->command_runner_;
  std::__cxx11::string::string((string *)&local_c0,"aws",&local_fa);
  std::__cxx11::string::string(local_a0,"s3",&local_fb);
  std::__cxx11::string::string(local_80,"rm",&local_fc);
  std::__cxx11::string::string(local_60,"--recursive",(allocator *)&local_fd);
  std::__cxx11::string::string(local_40,(string *)&full_url);
  __l_00._M_len = 5;
  __l_00._M_array = &local_c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f8,__l_00,&local_f9);
  MultipleCommandRunner::RunCommand(pMVar1,&local_f8,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  lVar2 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&local_c0._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::~string((string *)&full_url);
  return;
}

Assistant:

void AwsCommandRunner::Remove(const std::string& path) {
  std::string full_url = GetFullUrl(path);
  command_runner_->RunCommand({"aws", "s3", "rm", full_url}, true);
  command_runner_->RunCommand({"aws", "s3", "rm", "--recursive", full_url},
                              false);
}